

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O2

uintptr_t ngx_radix128tree_find(ngx_radix_tree_t *tree,u_char *key)

{
  ngx_radix_node_t *pnVar1;
  uintptr_t uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = 0xffffffffffffffff;
  lVar3 = 0;
  uVar4 = 0x80;
  while (pnVar1 = tree->root, pnVar1 != (ngx_radix_node_t *)0x0) {
    if (pnVar1->value != 0xffffffffffffffff) {
      uVar2 = pnVar1->value;
    }
    tree = (ngx_radix_tree_t *)(&pnVar1->right + ((uVar4 & key[lVar3]) == 0));
    uVar5 = uVar4 >> 1;
    uVar4 = uVar5;
    if (uVar5 == 0) {
      uVar4 = 0x80;
    }
    lVar3 = lVar3 + (ulong)(uVar5 == 0);
  }
  return uVar2;
}

Assistant:

uintptr_t
ngx_radix128tree_find(ngx_radix_tree_t *tree, u_char *key)
{
    u_char             bit;
    uintptr_t          value;
    ngx_uint_t         i;
    ngx_radix_node_t  *node;

    i = 0;
    bit = 0x80;
    value = NGX_RADIX_NO_VALUE;
    node = tree->root;

    while (node) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            value = node->value;
        }

        if (key[i] & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;

        if (bit == 0) {
            i++;
            bit = 0x80;
        }
    }

    return value;
}